

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *__x;
  pointer pDVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  pointer pDVar6;
  pointer pDVar7;
  DependSet intersection;
  DependSet common;
  bool local_aa;
  bool local_a9;
  cmComputeLinkDepends *local_a8;
  ulong local_a0;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_98;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  p_Var1 = &local_98._M_impl.super__Rb_tree_header;
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_a8 = this;
  for (local_a0 = 0;
      pDVar7 = (this->InferredDependSets).
               super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
               ._M_impl.super__Vector_impl_data._M_start,
      local_a0 <
      (ulong)((long)(this->InferredDependSets).
                    super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7 >> 5);
      local_a0 = local_a0 + 1) {
    if (pDVar7[local_a0].Initialized == true) {
      pDVar7 = pDVar7 + local_a0;
      __x = *(_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              **)&(pDVar7->
                  super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ).
                  super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ._M_impl;
      if (__x != *(_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   **)((long)&(pDVar7->
                              super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                              ).
                              super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                              ._M_impl + 8)) {
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_Rb_tree(&local_60,__x);
        pDVar3 = *(pointer *)
                  ((long)&(pDVar7->
                          super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                          ).
                          super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                          ._M_impl + 8);
        pDVar6 = *(pointer *)
                  &(pDVar7->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl;
        while (pDVar6 + 1 != pDVar3) {
          local_98._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_98._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          std::
          __set_intersection<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,std::insert_iterator<cmComputeLinkDepends::DependSet>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
                     *(_Base_ptr *)
                      ((long)&pDVar6[1].
                              super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              ._M_t._M_impl + 0x18),
                     (_Rb_tree_header *)
                     ((long)&pDVar6[1].
                             super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             ._M_t._M_impl + 8),&local_98,p_Var1);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::operator=(&local_60,&local_98);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_98);
          pDVar6 = pDVar6 + 1;
        }
        pcVar4 = (local_a8->EntryConstraintGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
        this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar4 + local_a0);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::reserve
                  ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00,
                   ((long)*(pointer *)
                           ((long)&pcVar4[local_a0].
                                   super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8
                           ) -
                    *(long *)&pcVar4[local_a0].
                              super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> >> 5) +
                   local_60._M_impl.super__Rb_tree_header._M_node_count);
        for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != p_Var2; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)
            ) {
          local_a9 = true;
          local_aa = false;
          local_98._M_impl._0_8_ = 0;
          local_98._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_98);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long_const&,bool,bool,cmListFileBacktrace>
                    (this_00,(unsigned_long *)(p_Var5 + 1),&local_a9,&local_aa,
                     (cmListFileBacktrace *)&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_98._M_impl.super__Rb_tree_header);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_60);
        this = local_a8;
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (size_t depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList& sets = this->InferredDependSets[depender_index];
    if (!sets.Initialized || sets.empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSet common = sets.front();
    for (DependSet const& i : cmMakeRange(sets).advance(1)) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i.begin(), i.end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.reserve(edges.size() + common.size());
    for (auto const& c : common) {
      edges.emplace_back(c, true, false, cmListFileBacktrace());
    }
  }
}